

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::formatDateGen
          (CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc,multicaldate_t *date)

{
  int32_t *piVar1;
  multicaldate_t *date_00;
  int iVar2;
  vm_obj_id_t vVar3;
  ushort *puVar4;
  CVmTimeZone *this_00;
  char *tzabbr;
  size_t byte_size;
  uint argc;
  int32_t tzofs;
  int32_t daytime;
  uint local_60;
  int32_t dayno;
  ulong local_58;
  CVmObjDate *local_50;
  multicaldate_t *local_48;
  CVmDateLocale lc;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (formatDateGen(unsigned_int,vm_val_t*,unsigned_int*,multicaldate_t*)::desc == '\0') {
    formatDateGen();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&formatDateGen::desc);
  if (iVar2 == 0) {
    local_48 = date;
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar4 == (ushort *)0x0) {
      err_throw(0x900);
    }
    local_58 = (ulong)*puVar4;
    local_60 = argc;
    this_00 = get_tz_arg(1,argc);
    piVar1 = (int32_t *)(this->super_CVmObject).ext_;
    dayno = *piVar1;
    daytime = piVar1[1];
    tzabbr = CVmTimeZone::utc_to_local(this_00,&dayno,&daytime,&tzofs);
    date_00 = local_48;
    local_50 = this;
    (*local_48->_vptr_multicaldate_t[3])(local_48);
    CVmDateLocale::CVmDateLocale(&lc);
    byte_size = format_date(this,(char *)0x0,0,(char *)(puVar4 + 1),local_58,&lc,date_00,dayno,
                            daytime,tzabbr,tzofs);
    vVar3 = CVmObjString::create(0,byte_size);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    (**(code **)(*(long *)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8))
              (G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff),CVmObjString::metaclass_reg_);
    format_date(local_50,(char *)(*(long *)((long)&G_obj_table_X.pages_[(retval->val).obj >> 0xc]
                                                   [(retval->val).obj & 0xfff].ptr_ + 8) + 2),
                byte_size,(char *)(puVar4 + 1),local_58,&lc,date_00,dayno,daytime,tzabbr,tzofs);
    sp_ = sp_ + -(long)(int)local_60;
  }
  return 1;
}

Assistant:

int CVmObjDate::formatDateGen(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *oargc, multicaldate_t *date)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the format string */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* get my date and time in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 1, argc);
    int32_t dayno, daytime, tzofs;
    const char *tzabbr = get_local_time(dayno, daytime, tzofs, tz);

    /* convert the day number to a calendar date */
    date->set_dayno(dayno);

    /* do a formatting pass to determine how much space we need */
    CVmDateLocale lc Pvmg0_P;
    size_t buflen = format_date(
        vmg_ 0, 0, fmt, fmtlen, &lc, date, dayno, daytime, tzabbr, tzofs);

    /* create a string for the result */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buflen));
    CVmObjString *str = vm_objid_cast(CVmObjString, retval->val.obj);

    /* format the string into the buffer */
    format_date(vmg_ str->cons_get_buf(), buflen, fmt, fmtlen, &lc,
                date, dayno, daytime, tzabbr, tzofs);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}